

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFNumberTreeObjectHelper.cc
# Opt level: O0

void __thiscall
QPDFNumberTreeObjectHelper::QPDFNumberTreeObjectHelper
          (QPDFNumberTreeObjectHelper *this,QPDFObjectHandle *oh,QPDF *q,bool auto_repair)

{
  Members *this_00;
  QPDFObjectHandle local_38;
  byte local_21;
  QPDF *pQStack_20;
  bool auto_repair_local;
  QPDF *q_local;
  QPDFObjectHandle *oh_local;
  QPDFNumberTreeObjectHelper *this_local;
  
  local_21 = auto_repair;
  pQStack_20 = q;
  q_local = (QPDF *)oh;
  oh_local = (QPDFObjectHandle *)this;
  QPDFObjectHandle::QPDFObjectHandle(&local_38,oh);
  QPDFObjectHelper::QPDFObjectHelper(&this->super_QPDFObjectHelper,&local_38);
  QPDFObjectHandle::~QPDFObjectHandle(&local_38);
  (this->super_QPDFObjectHelper)._vptr_QPDFObjectHelper =
       (_func_int **)&PTR__QPDFNumberTreeObjectHelper_0058f728;
  this_00 = (Members *)operator_new(0x10);
  Members::Members(this_00,oh,pQStack_20,(bool)(local_21 & 1));
  std::shared_ptr<QPDFNumberTreeObjectHelper::Members>::
  shared_ptr<QPDFNumberTreeObjectHelper::Members,void>(&this->m,this_00);
  return;
}

Assistant:

QPDFNumberTreeObjectHelper::QPDFNumberTreeObjectHelper(
    QPDFObjectHandle oh, QPDF& q, bool auto_repair) :
    QPDFObjectHelper(oh),
    m(new Members(oh, q, auto_repair))
{
}